

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

int __thiscall deqp::gls::LongStressCase::init(LongStressCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  TextureLevel *pTVar9;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *this_00;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this_01;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this_02;
  MessageBuilder *pMVar10;
  TestLog *pTVar11;
  string *source;
  TestError *this_03;
  DebugInfoRenderer *this_04;
  int precision;
  int precision_00;
  char *pcVar12;
  allocator<char> local_2ae9;
  string local_2ae8;
  string local_2ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2aa8;
  string local_2a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a68;
  LogSection local_2a48;
  allocator<char> local_2a01;
  string local_2a00;
  string local_29e0;
  allocator<char> local_29b9;
  string local_29b8;
  string local_2998;
  ProgramSources local_2978;
  undefined1 local_28a8 [8];
  ShaderProgram prog;
  ProgramContext *progCtx_1;
  int progCtxNdx_1;
  bool anyProgramsFailed;
  string local_27c0;
  string local_27a0;
  string local_2780;
  string local_2760;
  string local_2740;
  string local_2720;
  string local_2700;
  string local_26e0;
  string local_26c0;
  string local_26a0;
  string local_2680;
  string local_2660;
  string local_2640;
  string local_2620;
  string local_2600;
  allocator<char> local_25d9;
  string local_25d8;
  allocator<char> local_25b1;
  string local_25b0;
  LogSection local_2590;
  char *local_2550;
  char *local_2548;
  string local_2540;
  string local_2520;
  byte local_24fa;
  allocator<char> local_24f9;
  string local_24f8;
  MessageBuilder local_24d8;
  MessageBuilder local_2358;
  MessageBuilder local_21d8;
  MessageBuilder local_2058;
  MessageBuilder local_1ed8;
  MessageBuilder local_1d58;
  MessageBuilder local_1bd8;
  MessageBuilder local_1a58;
  MessageBuilder local_18d8;
  MessageBuilder local_1758;
  MessageBuilder local_15d8;
  MessageBuilder local_1458;
  MessageBuilder local_12d8;
  MessageBuilder local_1158;
  MessageBuilder local_fd8;
  MessageBuilder local_e58;
  MessageBuilder local_cd8;
  MessageBuilder local_b58;
  MessageBuilder local_9d8;
  MessageBuilder local_858;
  MessageBuilder local_6d8;
  MessageBuilder local_558;
  MessageBuilder local_3d8;
  MessageBuilder local_258;
  TestLog *local_d8;
  TestLog *log;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_c8;
  value_type_conflict3 local_be;
  int local_bc;
  int i;
  SharedPtr<tcu::TextureLevel> local_90 [2];
  TextureFormat local_6c;
  int local_64;
  vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
  *pvStack_60;
  int texNdx;
  vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
  *prevProgCtxTextures;
  undefined1 local_50 [4];
  int prevProgCtxNdx;
  SharedPtr<tcu::TextureLevel> dummyTex;
  TextureFormat format;
  TextureSpec *spec;
  int texSpecNdx;
  ProgramResources *progRes;
  ProgramContext *progCtx;
  int progCtxNdx;
  LongStressCase *this_local;
  
  sVar3 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::size
                    (&this->m_programContexts);
  std::
  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
  ::resize(&this->m_programResources,sVar3);
  progCtx._4_4_ = 0;
  do {
    sVar3 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::size
                      (&this->m_programContexts);
    if ((int)sVar3 <= progCtx._4_4_) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear(&this->m_vertexIndices);
      for (local_bc = 0; local_bc < this->m_numVerticesPerDrawCall; local_bc = local_bc + 1) {
        local_be = (value_type_conflict3)local_bc;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&this->m_vertexIndices,&local_be);
      }
      local_c8._M_current =
           (unsigned_short *)
           std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     (&this->m_vertexIndices);
      log = (TestLog *)
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                      (&this->m_vertexIndices);
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                (&this->m_rnd,local_c8,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  )log);
      this_00 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Program> *)operator_new(0x48);
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::
      GLObjectManager(this_00);
      this->m_programs = this_00;
      this_01 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *)operator_new(0x48);
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
      GLObjectManager(this_01);
      this->m_buffers = this_01;
      this_02 = (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *)operator_new(0x48);
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
      GLObjectManager(this_02);
      this->m_textures = this_02;
      this->m_currentIteration = 0;
      local_d8 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_24d8,local_d8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_24d8,(char (*) [23])"Number of iterations: ")
      ;
      local_24fa = 0;
      if (this->m_numIterations < 1) {
        std::allocator<char>::allocator();
        local_24fa = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_24f8,"infinite",&local_24f9);
      }
      else {
        de::toString<int>(&local_24f8,&this->m_numIterations);
      }
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_24f8);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_2358,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_2358,(char (*) [37])"Number of draw calls per iteration: ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_numDrawCallsPerIteration);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_21d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_21d8,(char (*) [36])"Number of triangles per draw call: ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&this->m_numTrianglesPerDrawCall);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_2058,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_2058,(char (*) [22])"Using triangle strips");
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1ed8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1ed8,(char (*) [41])"Approximate texture memory usage limit: ");
      de::floatToString_abi_cxx11_
                (&local_2520,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,
                 precision);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2520);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])" MiB");
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1d58,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1d58,(char (*) [40])"Approximate buffer memory usage limit: ");
      de::floatToString_abi_cxx11_
                (&local_2540,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07,
                 precision_00);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2540);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])" MiB");
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1bd8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1bd8,
                           (char (*) [55])"Default vertex attribute data buffer usage parameter: ");
      local_2548 = glu::getUsageName(this->m_attrBufferUsage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2548);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1a58,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1a58,
                           (char (*) [51])"Default vertex index data buffer usage parameter: ");
      local_2550 = glu::getUsageName(this->m_indexBufferUsage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2550);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_25b0,"ProbabilityParams",&local_25b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_25d8,"Per-iteration probability parameters",&local_25d9);
      tcu::LogSection::LogSection(&local_2590,&local_25b0,&local_25d8);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_2590);
      tcu::TestLog::operator<<(&local_18d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Program re-build: ";
      pMVar10 = tcu::MessageBuilder::operator<<(&local_18d8,(char (*) [19])"Program re-build: ");
      probabilityStr_abi_cxx11_(&local_2600,(gls *)pcVar12,(this->m_probabilities).rebuildProgram);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2600);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1758,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Texture re-upload: ";
      pMVar10 = tcu::MessageBuilder::operator<<(&local_1758,(char (*) [20])"Texture re-upload: ");
      probabilityStr_abi_cxx11_(&local_2620,(gls *)pcVar12,(this->m_probabilities).reuploadTexture);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2620);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_15d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Buffer re-upload: ";
      pMVar10 = tcu::MessageBuilder::operator<<(&local_15d8,(char (*) [19])"Buffer re-upload: ");
      probabilityStr_abi_cxx11_(&local_2640,(gls *)pcVar12,(this->m_probabilities).reuploadBuffer);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2640);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1458,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use glTexImage* instead of glTexSubImage* when uploading texture: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1458,
                           (char (*) [67])
                           "Use glTexImage* instead of glTexSubImage* when uploading texture: ");
      probabilityStr_abi_cxx11_
                (&local_2660,(gls *)pcVar12,(this->m_probabilities).reuploadWithTexImage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2660);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_12d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use glBufferData* instead of glBufferSubData* when uploading buffer: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_12d8,
                           (char (*) [70])
                           "Use glBufferData* instead of glBufferSubData* when uploading buffer: ");
      probabilityStr_abi_cxx11_
                (&local_2680,(gls *)pcVar12,(this->m_probabilities).reuploadWithBufferData);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2680);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_1158,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Delete texture after using it, even if could re-use it: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1158,
                           (char (*) [57])"Delete texture after using it, even if could re-use it: "
                          );
      probabilityStr_abi_cxx11_(&local_26a0,(gls *)pcVar12,(this->m_probabilities).deleteTexture);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_26a0);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_fd8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Delete buffer after using it, even if could re-use it: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_fd8,
                           (char (*) [56])"Delete buffer after using it, even if could re-use it: ")
      ;
      probabilityStr_abi_cxx11_(&local_26c0,(gls *)pcVar12,(this->m_probabilities).deleteBuffer);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_26c0);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_e58,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Don\'t re-use texture, and only delete if memory limit is hit: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_e58,
                           (char (*) [63])
                           "Don\'t re-use texture, and only delete if memory limit is hit: ");
      probabilityStr_abi_cxx11_
                (&local_26e0,(gls *)pcVar12,(this->m_probabilities).wastefulTextureMemoryUsage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_26e0);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_cd8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Don\'t re-use buffer, and only delete if memory limit is hit: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_cd8,
                           (char (*) [62])
                           "Don\'t re-use buffer, and only delete if memory limit is hit: ");
      probabilityStr_abi_cxx11_
                (&local_2700,(gls *)pcVar12,(this->m_probabilities).wastefulBufferMemoryUsage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2700);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_b58,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use client memory (instead of GL buffers) for vertex attribute data: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_b58,
                           (char (*) [70])
                           "Use client memory (instead of GL buffers) for vertex attribute data: ");
      probabilityStr_abi_cxx11_
                (&local_2720,(gls *)pcVar12,(this->m_probabilities).clientMemoryAttributeData);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2720);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_9d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use client memory (instead of GL buffers) for vertex index data: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_9d8,
                           (char (*) [66])
                           "Use client memory (instead of GL buffers) for vertex index data: ");
      probabilityStr_abi_cxx11_
                (&local_2740,(gls *)pcVar12,(this->m_probabilities).clientMemoryIndexData);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2740);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_858,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use random target parameter when uploading buffer data: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_858,
                           (char (*) [57])"Use random target parameter when uploading buffer data: "
                          );
      probabilityStr_abi_cxx11_
                (&local_2760,(gls *)pcVar12,(this->m_probabilities).randomBufferUploadTarget);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2760);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_6d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use random usage parameter when uploading buffer data: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_6d8,
                           (char (*) [56])"Use random usage parameter when uploading buffer data: ")
      ;
      probabilityStr_abi_cxx11_
                (&local_2780,(gls *)pcVar12,(this->m_probabilities).randomBufferUsage);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2780);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_558,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use glDrawArrays instead of glDrawElements: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_558,(char (*) [45])"Use glDrawArrays instead of glDrawElements: ")
      ;
      probabilityStr_abi_cxx11_(&local_27a0,(gls *)pcVar12,(this->m_probabilities).useDrawArrays);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_27a0);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_3d8,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pcVar12 = "Use separate buffers for each attribute, instead of one array for all: ";
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_3d8,
                           (char (*) [72])
                           "Use separate buffers for each attribute, instead of one array for all: "
                          );
      probabilityStr_abi_cxx11_
                (&local_27c0,(gls *)pcVar12,(this->m_probabilities).separateAttributeBuffers);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_27c0);
      pTVar11 = tcu::MessageBuilder::operator<<
                          (pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pTVar11 = tcu::TestLog::operator<<(pTVar11,(EndSectionToken *)&tcu::TestLog::EndSection);
      tcu::TestLog::operator<<(&local_258,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [7])"Using ");
      _progCtxNdx_1 =
           std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::size
                     (&this->m_programContexts);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(unsigned_long *)&progCtxNdx_1);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [12])" program(s)");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_258);
      std::__cxx11::string::~string((string *)&local_27c0);
      tcu::MessageBuilder::~MessageBuilder(&local_3d8);
      std::__cxx11::string::~string((string *)&local_27a0);
      tcu::MessageBuilder::~MessageBuilder(&local_558);
      std::__cxx11::string::~string((string *)&local_2780);
      tcu::MessageBuilder::~MessageBuilder(&local_6d8);
      std::__cxx11::string::~string((string *)&local_2760);
      tcu::MessageBuilder::~MessageBuilder(&local_858);
      std::__cxx11::string::~string((string *)&local_2740);
      tcu::MessageBuilder::~MessageBuilder(&local_9d8);
      std::__cxx11::string::~string((string *)&local_2720);
      tcu::MessageBuilder::~MessageBuilder(&local_b58);
      std::__cxx11::string::~string((string *)&local_2700);
      tcu::MessageBuilder::~MessageBuilder(&local_cd8);
      std::__cxx11::string::~string((string *)&local_26e0);
      tcu::MessageBuilder::~MessageBuilder(&local_e58);
      std::__cxx11::string::~string((string *)&local_26c0);
      tcu::MessageBuilder::~MessageBuilder(&local_fd8);
      std::__cxx11::string::~string((string *)&local_26a0);
      tcu::MessageBuilder::~MessageBuilder(&local_1158);
      std::__cxx11::string::~string((string *)&local_2680);
      tcu::MessageBuilder::~MessageBuilder(&local_12d8);
      std::__cxx11::string::~string((string *)&local_2660);
      tcu::MessageBuilder::~MessageBuilder(&local_1458);
      std::__cxx11::string::~string((string *)&local_2640);
      tcu::MessageBuilder::~MessageBuilder(&local_15d8);
      std::__cxx11::string::~string((string *)&local_2620);
      tcu::MessageBuilder::~MessageBuilder(&local_1758);
      std::__cxx11::string::~string((string *)&local_2600);
      tcu::MessageBuilder::~MessageBuilder(&local_18d8);
      tcu::LogSection::~LogSection(&local_2590);
      std::__cxx11::string::~string((string *)&local_25d8);
      std::allocator<char>::~allocator(&local_25d9);
      std::__cxx11::string::~string((string *)&local_25b0);
      std::allocator<char>::~allocator(&local_25b1);
      tcu::MessageBuilder::~MessageBuilder(&local_1a58);
      tcu::MessageBuilder::~MessageBuilder(&local_1bd8);
      std::__cxx11::string::~string((string *)&local_2540);
      tcu::MessageBuilder::~MessageBuilder(&local_1d58);
      std::__cxx11::string::~string((string *)&local_2520);
      tcu::MessageBuilder::~MessageBuilder(&local_1ed8);
      tcu::MessageBuilder::~MessageBuilder(&local_2058);
      tcu::MessageBuilder::~MessageBuilder(&local_21d8);
      tcu::MessageBuilder::~MessageBuilder(&local_2358);
      std::__cxx11::string::~string((string *)&local_24f8);
      if ((local_24fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_24f9);
      }
      tcu::MessageBuilder::~MessageBuilder(&local_24d8);
      progCtx_1._7_1_ = 0;
      for (progCtx_1._0_4_ = 0; iVar2 = (int)progCtx_1,
          sVar3 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                  ::size(&this->m_programContexts), iVar2 < (int)sVar3;
          progCtx_1._0_4_ = (int)progCtx_1 + 1) {
        pvVar4 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>
                 ::operator[](&this->m_programContexts,(long)(int)progCtx_1);
        renderCtx = this->m_renderCtx;
        prog.m_program.m_info.linkTimeUs = (deUint64)pvVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_29b8,"",&local_29b9);
        mangleShaderNames(&local_2998,&pvVar4->vertexSource,&local_29b8);
        source = (string *)(prog.m_program.m_info.linkTimeUs + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a00,"",&local_2a01);
        mangleShaderNames(&local_29e0,source,&local_2a00);
        glu::makeVtxFragSources(&local_2978,&local_2998,&local_29e0);
        glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_28a8,renderCtx,&local_2978);
        glu::ProgramSources::~ProgramSources(&local_2978);
        std::__cxx11::string::~string((string *)&local_29e0);
        std::__cxx11::string::~string((string *)&local_2a00);
        std::allocator<char>::~allocator(&local_2a01);
        std::__cxx11::string::~string((string *)&local_2998);
        std::__cxx11::string::~string((string *)&local_29b8);
        std::allocator<char>::~allocator(&local_29b9);
        pTVar11 = local_d8;
        de::toString<int>(&local_2a88,(int *)&progCtx_1);
        std::operator+(&local_2a68,"ShaderProgram",&local_2a88);
        de::toString<int>(&local_2ac8,(int *)&progCtx_1);
        std::operator+(&local_2aa8,"Shader program ",&local_2ac8);
        tcu::LogSection::LogSection(&local_2a48,&local_2a68,&local_2aa8);
        pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_2a48);
        pTVar11 = glu::operator<<(pTVar11,(ShaderProgram *)local_28a8);
        tcu::TestLog::operator<<(pTVar11,(EndSectionToken *)&tcu::TestLog::EndSection);
        tcu::LogSection::~LogSection(&local_2a48);
        std::__cxx11::string::~string((string *)&local_2aa8);
        std::__cxx11::string::~string((string *)&local_2ac8);
        std::__cxx11::string::~string((string *)&local_2a68);
        std::__cxx11::string::~string((string *)&local_2a88);
        bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_28a8);
        if (!bVar1) {
          progCtx_1._7_1_ = 1;
        }
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_28a8);
      }
      if ((progCtx_1._7_1_ & 1) == 0) {
        if ((this->m_showDebugInfo & 1U) != 0) {
          this_04 = (DebugInfoRenderer *)operator_new(0x40);
          LongStressCaseInternal::DebugInfoRenderer::DebugInfoRenderer(this_04,this->m_renderCtx);
          this->m_debugInfoRenderer = this_04;
        }
        return (int)this;
      }
      this_03 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2ae8,"One or more shader programs failed to compile",&local_2ae9);
      tcu::TestError::TestError(this_03,&local_2ae8);
      __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pvVar4 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
             operator[](&this->m_programContexts,(long)progCtx._4_4_);
    pvVar5 = std::
             vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
             ::operator[](&this->m_programResources,(long)progCtx._4_4_);
    for (spec._4_4_ = 0;
        sVar3 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::size
                          (&pvVar4->textureSpecs), spec._4_4_ < (int)sVar3;
        spec._4_4_ = spec._4_4_ + 1) {
      pvVar6 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
               operator[](&pvVar4->textureSpecs,(long)spec._4_4_);
      dummyTex.m_state =
           (SharedPtrStateBase *)glu::mapGLTransferFormat(pvVar6->format,pvVar6->dataType);
      de::SharedPtr<tcu::TextureLevel>::SharedPtr((SharedPtr<tcu::TextureLevel> *)local_50);
      for (prevProgCtxTextures._4_4_ = 0; iVar2 = prevProgCtxTextures._4_4_,
          sVar3 = std::
                  vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                  ::size(&this->m_programResources), iVar2 < (int)sVar3;
          prevProgCtxTextures._4_4_ = prevProgCtxTextures._4_4_ + 1) {
        pvVar7 = std::
                 vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
                 ::operator[](&this->m_programResources,(long)prevProgCtxTextures._4_4_);
        pvStack_60 = &pvVar7->dummyTextures;
        for (local_64 = 0; iVar2 = local_64,
            sVar3 = std::
                    vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                    ::size(pvStack_60), iVar2 < (int)sVar3; local_64 = local_64 + 1) {
          pvVar8 = std::
                   vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                   ::operator[](pvStack_60,(long)local_64);
          pTVar9 = de::SharedPtr<tcu::TextureLevel>::operator->(pvVar8);
          local_6c = tcu::TextureLevel::getFormat(pTVar9);
          bVar1 = tcu::TextureFormat::operator==(&local_6c,(TextureFormat *)&dummyTex.m_state);
          if (bVar1) {
            pvVar8 = std::
                     vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                     ::operator[](pvStack_60,(long)local_64);
            de::SharedPtr<tcu::TextureLevel>::operator=
                      ((SharedPtr<tcu::TextureLevel> *)local_50,pvVar8);
            break;
          }
        }
      }
      bVar1 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)local_50);
      if (!bVar1) {
        pTVar9 = (TextureLevel *)operator_new(0x28);
        tcu::TextureLevel::TextureLevel(pTVar9,(TextureFormat *)&dummyTex.m_state);
        de::SharedPtr<tcu::TextureLevel>::SharedPtr(local_90,pTVar9);
        de::SharedPtr<tcu::TextureLevel>::operator=
                  ((SharedPtr<tcu::TextureLevel> *)local_50,local_90);
        de::SharedPtr<tcu::TextureLevel>::~SharedPtr(local_90);
      }
      pTVar9 = de::SharedPtr<tcu::TextureLevel>::operator->
                         ((SharedPtr<tcu::TextureLevel> *)local_50);
      iVar2 = tcu::TextureLevel::getWidth(pTVar9);
      if (iVar2 < pvVar6->width) {
LAB_02626a29:
        pTVar9 = de::SharedPtr<tcu::TextureLevel>::operator->
                           ((SharedPtr<tcu::TextureLevel> *)local_50);
        tcu::TextureLevel::setSize(pTVar9,pvVar6->width,pvVar6->height,1);
        pTVar9 = de::SharedPtr<tcu::TextureLevel>::operator->
                           ((SharedPtr<tcu::TextureLevel> *)local_50);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&stack0xffffffffffffff48,pTVar9);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)&stack0xffffffffffffff48,&pvVar6->minValue,&pvVar6->maxValue
                  );
      }
      else {
        pTVar9 = de::SharedPtr<tcu::TextureLevel>::operator->
                           ((SharedPtr<tcu::TextureLevel> *)local_50);
        iVar2 = tcu::TextureLevel::getHeight(pTVar9);
        if (iVar2 < pvVar6->height) goto LAB_02626a29;
      }
      std::
      vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>::
      push_back(&pvVar5->dummyTextures,(value_type *)local_50);
      de::SharedPtr<tcu::TextureLevel>::~SharedPtr((SharedPtr<tcu::TextureLevel> *)local_50);
    }
    progCtx._4_4_ = progCtx._4_4_ + 1;
  } while( true );
}

Assistant:

void LongStressCase::init (void)
{
	// Generate dummy texture data for each texture spec in m_programContexts.

	DE_ASSERT(!m_programContexts.empty());
	DE_ASSERT(m_programResources.empty());
	m_programResources.resize(m_programContexts.size());

	for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
	{
		const ProgramContext&	progCtx = m_programContexts[progCtxNdx];
		ProgramResources&		progRes = m_programResources[progCtxNdx];

		for (int texSpecNdx = 0; texSpecNdx < (int)progCtx.textureSpecs.size(); texSpecNdx++)
		{
			const TextureSpec&		spec	= progCtx.textureSpecs[texSpecNdx];
			const TextureFormat		format	= glu::mapGLTransferFormat(spec.format, spec.dataType);

			// If texture data with the same format has already been generated, re-use that (don't care much about contents).

			SharedPtr<TextureLevel> dummyTex;

			for (int prevProgCtxNdx = 0; prevProgCtxNdx < (int)m_programResources.size(); prevProgCtxNdx++)
			{
				const vector<SharedPtr<TextureLevel> >& prevProgCtxTextures = m_programResources[prevProgCtxNdx].dummyTextures;

				for (int texNdx = 0; texNdx < (int)prevProgCtxTextures.size(); texNdx++)
				{
					if (prevProgCtxTextures[texNdx]->getFormat() == format)
					{
						dummyTex = prevProgCtxTextures[texNdx];
						break;
					}
				}
			}

			if (!dummyTex)
				dummyTex = SharedPtr<TextureLevel>(new TextureLevel(format));

			if (dummyTex->getWidth() < spec.width || dummyTex->getHeight() < spec.height)
			{
				dummyTex->setSize(spec.width, spec.height);
				tcu::fillWithComponentGradients(dummyTex->getAccess(), spec.minValue, spec.maxValue);
			}

			progRes.dummyTextures.push_back(dummyTex);
		}
	}

	m_vertexIndices.clear();
	for (int i = 0; i < m_numVerticesPerDrawCall; i++)
		m_vertexIndices.push_back((deUint16)i);
	m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

	DE_ASSERT(!m_programs && !m_buffers && !m_textures);
	m_programs = new GLObjectManager<Program>;
	m_buffers = new GLObjectManager<Buffer>;
	m_textures = new GLObjectManager<Texture>;

	m_currentIteration = 0;

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Number of iterations: "										<< (m_numIterations > 0 ? toString(m_numIterations) : "infinite")				<< TestLog::EndMessage
			<< TestLog::Message << "Number of draw calls per iteration: "						<< m_numDrawCallsPerIteration													<< TestLog::EndMessage
			<< TestLog::Message << "Number of triangles per draw call: "						<< m_numTrianglesPerDrawCall													<< TestLog::EndMessage
			<< TestLog::Message << "Using triangle strips"																														<< TestLog::EndMessage
			<< TestLog::Message << "Approximate texture memory usage limit: "					<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Approximate buffer memory usage limit: "					<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"			<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex attribute data buffer usage parameter: "		<< glu::getUsageName(m_attrBufferUsage)											<< TestLog::EndMessage
			<< TestLog::Message << "Default vertex index data buffer usage parameter: "			<< glu::getUsageName(m_indexBufferUsage)										<< TestLog::EndMessage

			<< TestLog::Section("ProbabilityParams", "Per-iteration probability parameters")
			<< TestLog::Message << "Program re-build: "															<< probabilityStr(m_probabilities.rebuildProgram)				<< TestLog::EndMessage
			<< TestLog::Message << "Texture re-upload: "														<< probabilityStr(m_probabilities.reuploadTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Buffer re-upload: "															<< probabilityStr(m_probabilities.reuploadBuffer)				<< TestLog::EndMessage
			<< TestLog::Message << "Use glTexImage* instead of glTexSubImage* when uploading texture: "			<< probabilityStr(m_probabilities.reuploadWithTexImage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glBufferData* instead of glBufferSubData* when uploading buffer: "		<< probabilityStr(m_probabilities.reuploadWithBufferData)		<< TestLog::EndMessage
			<< TestLog::Message << "Delete texture after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteTexture)				<< TestLog::EndMessage
			<< TestLog::Message << "Delete buffer after using it, even if could re-use it: "					<< probabilityStr(m_probabilities.deleteBuffer)					<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use texture, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulTextureMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Don't re-use buffer, and only delete if memory limit is hit: "				<< probabilityStr(m_probabilities.wastefulBufferMemoryUsage)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex attribute data: "		<< probabilityStr(m_probabilities.clientMemoryAttributeData)	<< TestLog::EndMessage
			<< TestLog::Message << "Use client memory (instead of GL buffers) for vertex index data: "			<< probabilityStr(m_probabilities.clientMemoryIndexData)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random target parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUploadTarget)		<< TestLog::EndMessage
			<< TestLog::Message << "Use random usage parameter when uploading buffer data: "					<< probabilityStr(m_probabilities.randomBufferUsage)			<< TestLog::EndMessage
			<< TestLog::Message << "Use glDrawArrays instead of glDrawElements: "								<< probabilityStr(m_probabilities.useDrawArrays)				<< TestLog::EndMessage
			<< TestLog::Message << "Use separate buffers for each attribute, instead of one array for all: "	<< probabilityStr(m_probabilities.separateAttributeBuffers)		<< TestLog::EndMessage
			<< TestLog::EndSection
			<< TestLog::Message << "Using " << m_programContexts.size() << " program(s)" << TestLog::EndMessage;

		bool anyProgramsFailed = false;
		for (int progCtxNdx = 0; progCtxNdx < (int)m_programContexts.size(); progCtxNdx++)
		{
			const ProgramContext& progCtx = m_programContexts[progCtxNdx];
			glu::ShaderProgram prog(m_renderCtx, glu::makeVtxFragSources(mangleShaderNames(progCtx.vertexSource, ""), mangleShaderNames(progCtx.fragmentSource, "")));
			log << TestLog::Section("ShaderProgram" + toString(progCtxNdx), "Shader program " + toString(progCtxNdx)) << prog << TestLog::EndSection;
			if (!prog.isOk())
				anyProgramsFailed = true;
		}

		if (anyProgramsFailed)
			throw tcu::TestError("One or more shader programs failed to compile");
	}

	DE_ASSERT(!m_debugInfoRenderer);
	if (m_showDebugInfo)
		m_debugInfoRenderer = new DebugInfoRenderer(m_renderCtx);
}